

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

XMLNode __thiscall
XMLParser::XMLNode::parseString(XMLNode *this,char *lpszXML,char *tag,XMLResults *pResults)

{
  char cVar1;
  int iVar2;
  XMLNode local_98;
  char *local_90;
  char *name;
  XMLError local_80;
  XMLError error;
  char *local_70;
  XML xml;
  XMLNode xnode;
  XMLResults *pResults_local;
  char *tag_local;
  char *lpszXML_local;
  
  if (lpszXML == (char *)0x0) {
    if (pResults != (XMLResults *)0x0) {
      pResults->error = eXMLErrorNoElements;
      pResults->nLine = 0;
      pResults->nColumn = 0;
    }
    XMLNode(this,(XMLNode *)&emptyXMLNode);
    return (XMLNode)(XMLNodeData *)this;
  }
  XMLNode((XMLNode *)&xml.cbNewElement,(XMLNodeData *)0x0,(char *)0x0,'\0');
  xml.lpszText._0_4_ = 0;
  xml.lpszText._4_4_ = 0;
  xml.nIndex = 0;
  xml.error = eXMLErrorNone;
  xml._28_4_ = 0;
  xml.lpEndTag._0_4_ = 0;
  xml.cbEndTag = 0;
  xml._44_4_ = 0;
  xml.lpNewElement._0_4_ = 0;
  xml.lpNewElement._4_4_ = 1;
  local_70 = lpszXML;
  xml.lpXML = lpszXML;
  ParseXMLElement((XMLNode *)&xml.cbNewElement,&local_70);
  local_80 = xml.nIndex;
  iVar2 = nChildNode((XMLNode *)&xml.cbNewElement);
  if (iVar2 == 0) {
    local_80 = eXMLErrorNoXMLTagFound;
  }
  iVar2 = nChildNode((XMLNode *)&xml.cbNewElement);
  if ((iVar2 == 1) && (iVar2 = nElement((XMLNode *)&xml.cbNewElement), iVar2 == 1)) {
    getChildNode((XMLNode *)&name,(int)&xml + 0x38);
    operator=((XMLNode *)&xml.cbNewElement,(XMLNode *)&name);
    ~XMLNode((XMLNode *)&name);
  }
  if (((local_80 == eXMLErrorNone) || (local_80 == eXMLErrorMissingEndTag)) ||
     (local_80 == eXMLErrorNoXMLTagFound)) {
    local_90 = getName((XMLNode *)&xml.cbNewElement);
    if (((tag != (char *)0x0) && (*tag != '\0')) &&
       ((local_90 == (char *)0x0 || (iVar2 = xstricmp(local_90,tag), iVar2 != 0)))) {
      getChildNode(&local_98,(char *)&xml.cbNewElement,(int *)tag);
      operator=((XMLNode *)&xml.cbNewElement,&local_98);
      ~XMLNode(&local_98);
      cVar1 = isEmpty((XMLNode *)&xml.cbNewElement);
      if (cVar1 != '\0') {
        if (pResults != (XMLResults *)0x0) {
          pResults->error = eXMLErrorFirstTagNotFound;
          pResults->nLine = 0;
          pResults->nColumn = 0;
        }
        XMLNode(this,(XMLNode *)&emptyXMLNode);
        goto LAB_0023bbd3;
      }
    }
  }
  else {
    operator=((XMLNode *)&xml.cbNewElement,(XMLNode *)&emptyXMLNode);
  }
  if ((pResults != (XMLResults *)0x0) && (pResults->error = local_80, local_80 != eXMLErrorNone)) {
    if (local_80 == eXMLErrorMissingEndTag) {
      xml.lpszText._0_4_ = xml.lpszText._4_4_;
    }
    CountLinesAndColumns(local_70,(int)xml.lpszText,pResults);
  }
  XMLNode(this,(XMLNode *)&xml.cbNewElement);
LAB_0023bbd3:
  ~XMLNode((XMLNode *)&xml.cbNewElement);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::parseString(XMLCSTR lpszXML, XMLCSTR tag, XMLResults * pResults)
    {
        if(!lpszXML)
        {
            if(pResults)
            {
                pResults->error = eXMLErrorNoElements;
                pResults->nLine = 0;
                pResults->nColumn = 0;
            }
            return emptyXMLNode;
        }

        XMLNode xnode(NULL, NULL, FALSE);
        struct XML xml = {lpszXML, lpszXML, 0, 0, eXMLErrorNone, NULL, 0, NULL, 0, TRUE};

        // Create header element
        xnode.ParseXMLElement(&xml);
        enum XMLError error = xml.error;
        if(!xnode.nChildNode())
            error = eXMLErrorNoXMLTagFound;
        if((xnode.nChildNode() == 1) && (xnode.nElement() == 1))
            xnode = xnode.getChildNode();   // skip the empty node

        // If no error occurred
        if((error == eXMLErrorNone) || (error == eXMLErrorMissingEndTag)
           || (error == eXMLErrorNoXMLTagFound))
        {
            XMLCSTR name = xnode.getName();
            if(tag && (*tag) && ((!name) || (xstricmp(name, tag))))
            {
                xnode = xnode.getChildNode(tag);
                if(xnode.isEmpty())
                {
                    if(pResults)
                    {
                        pResults->error = eXMLErrorFirstTagNotFound;
                        pResults->nLine = 0;
                        pResults->nColumn = 0;
                    }
                    return emptyXMLNode;
                }
            }
        }
        else
        {
            // Cleanup: this will destroy all the nodes
            xnode = emptyXMLNode;
        }


        // If we have been given somewhere to place results
        if(pResults)
        {
            pResults->error = error;

            // If we have an error
            if(error != eXMLErrorNone)
            {
                if(error == eXMLErrorMissingEndTag)
                    xml.nIndex = xml.nIndexMissigEndTag;
                // Find which line and column it starts on.
                CountLinesAndColumns(xml.lpXML, xml.nIndex, pResults);
            }
        }
        return xnode;
    }